

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O1

lzma_ret lzma_index_append(lzma_index *i,lzma_allocator *allocator,lzma_vli unpadded_size,
                          lzma_vli uncompressed_size)

{
  index_tree_node *piVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  lzma_vli lVar5;
  long lVar6;
  index_tree_node *piVar7;
  index_tree_node *node;
  lzma_ret lVar8;
  lzma_vli lVar9;
  index_tree_node *local_60;
  
  lVar8 = LZMA_PROG_ERROR;
  if (((-1 < (long)uncompressed_size) && (i != (lzma_index *)0x0)) &&
     (0x8000000000000007 < unpadded_size + 0x8000000000000003)) {
    piVar1 = (i->streams).rightmost;
    node = piVar1[1].right;
    if (node == (index_tree_node *)0x0) {
      lVar9 = 0;
    }
    else {
      if ((long)(&node[1].right)[(long)node[1].parent * 2] < 0) goto LAB_006991b0;
      lVar9 = (ulong)((long)&(&node[1].right)[(long)node[1].parent * 2]->uncompressed_base + 3U) &
              0xfffffffffffffffc;
    }
    if (node == (index_tree_node *)0x0) {
      local_60 = (index_tree_node *)0x0;
    }
    else {
      local_60 = (&node[1].left)[(long)node[1].parent * 2];
    }
    uVar2 = lzma_vli_size(unpadded_size);
    uVar3 = lzma_vli_size(uncompressed_size);
    uVar4 = (ulong)(uVar3 + uVar2);
    lVar5 = index_file_size(piVar1->compressed_base,lVar9 + unpadded_size,
                            piVar1[2].compressed_base + 1,
                            (long)&(piVar1[2].parent)->uncompressed_base + uVar4,
                            piVar1[4].uncompressed_base);
    lVar8 = LZMA_DATA_ERROR;
    if (lVar5 != 0xffffffffffffffff) {
      lVar5 = i->index_list_size;
      uVar2 = lzma_vli_size(i->record_count + 1);
      lVar6 = (ulong)(uVar2 + 1) + lVar5 + uVar4;
      if (lVar6 + 4 < 0) {
LAB_006991b0:
        __assert_fail("vli <= LZMA_VLI_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.h"
                      ,0x29,"lzma_vli vli_ceil4(lzma_vli)");
      }
      if ((lVar6 + 7U & 0xfffffffffffffffc) < 0x400000001) {
        if ((node == (index_tree_node *)0x0) ||
           (piVar7 = (index_tree_node *)((long)&(node[1].parent)->uncompressed_base + 1),
           (index_tree_node *)node[1].compressed_base <= piVar7)) {
          node = (index_tree_node *)lzma_alloc(i->prealloc * 0x10 + 0x40,allocator);
          if (node == (index_tree_node *)0x0) {
            return LZMA_MEM_ERROR;
          }
          node[1].parent = (index_tree_node *)0x0;
          node[1].compressed_base = i->prealloc;
          i->prealloc = 0x200;
          node->uncompressed_base = (lzma_vli)local_60;
          node->compressed_base = lVar9;
          node[1].uncompressed_base = piVar1[2].compressed_base + 1;
          index_tree_append((index_tree *)&piVar1[1].parent,node);
        }
        else {
          node[1].parent = piVar7;
        }
        piVar7 = node[1].parent;
        (&node[1].left)[(long)piVar7 * 2] =
             (index_tree_node *)((long)&local_60->uncompressed_base + uncompressed_size);
        (&node[1].right)[(long)piVar7 * 2] = (index_tree_node *)(lVar9 + unpadded_size);
        piVar1[2].compressed_base = piVar1[2].compressed_base + 1;
        piVar1[2].parent = (index_tree_node *)((long)&(piVar1[2].parent)->uncompressed_base + uVar4)
        ;
        if ((long)unpadded_size < 0) goto LAB_006991b0;
        i->total_size = i->total_size + (unpadded_size + 3 & 0xfffffffffffffffc);
        i->uncompressed_size = i->uncompressed_size + uncompressed_size;
        i->record_count = i->record_count + 1;
        i->index_list_size = i->index_list_size + uVar4;
        lVar8 = LZMA_OK;
      }
    }
  }
  return lVar8;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_index_append(lzma_index *i, const lzma_allocator *allocator,
		lzma_vli unpadded_size, lzma_vli uncompressed_size)
{
	// Validate.
	if (i == NULL || unpadded_size < UNPADDED_SIZE_MIN
			|| unpadded_size > UNPADDED_SIZE_MAX
			|| uncompressed_size > LZMA_VLI_MAX)
		return LZMA_PROG_ERROR;

	index_stream *s = (index_stream *)(i->streams.rightmost);
	index_group *g = (index_group *)(s->groups.rightmost);

	const lzma_vli compressed_base = g == NULL ? 0
			: vli_ceil4(g->records[g->last].unpadded_sum);
	const lzma_vli uncompressed_base = g == NULL ? 0
			: g->records[g->last].uncompressed_sum;
	const uint32_t index_list_size_add = lzma_vli_size(unpadded_size)
			+ lzma_vli_size(uncompressed_size);

	// Check that the file size will stay within limits.
	if (index_file_size(s->node.compressed_base,
			compressed_base + unpadded_size, s->record_count + 1,
			s->index_list_size + index_list_size_add,
			s->stream_padding) == LZMA_VLI_UNKNOWN)
		return LZMA_DATA_ERROR;

	// The size of the Index field must not exceed the maximum value
	// that can be stored in the Backward Size field.
	if (index_size(i->record_count + 1,
			i->index_list_size + index_list_size_add)
			> LZMA_BACKWARD_SIZE_MAX)
		return LZMA_DATA_ERROR;

	if (g != NULL && g->last + 1 < g->allocated) {
		// There is space in the last group at least for one Record.
		++g->last;
	} else {
		// We need to allocate a new group.
		g = lzma_alloc(sizeof(index_group)
				+ i->prealloc * sizeof(index_record),
				allocator);
		if (g == NULL)
			return LZMA_MEM_ERROR;

		g->last = 0;
		g->allocated = i->prealloc;

		// Reset prealloc so that if the application happens to
		// add new Records, the allocation size will be sane.
		i->prealloc = INDEX_GROUP_SIZE;

		// Set the start offsets of this group.
		g->node.uncompressed_base = uncompressed_base;
		g->node.compressed_base = compressed_base;
		g->number_base = s->record_count + 1;

		// Add the new group to the Stream.
		index_tree_append(&s->groups, &g->node);
	}

	// Add the new Record to the group.
	g->records[g->last].uncompressed_sum
			= uncompressed_base + uncompressed_size;
	g->records[g->last].unpadded_sum
			= compressed_base + unpadded_size;

	// Update the totals.
	++s->record_count;
	s->index_list_size += index_list_size_add;

	i->total_size += vli_ceil4(unpadded_size);
	i->uncompressed_size += uncompressed_size;
	++i->record_count;
	i->index_list_size += index_list_size_add;

	return LZMA_OK;
}